

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::SubroutineSymbol::connectExternInterfacePrototype(SubroutineSymbol *this)

{
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  string_view name;
  string_view name_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  bool bVar1;
  Symbol *pSVar2;
  ExternImpl *pEVar3;
  Symbol *in_RDI;
  MethodPrototypeSymbol *modportProto;
  const_iterator it;
  Diagnostic *diag_2;
  MethodPrototypeSymbol *proto;
  Diagnostic *diag_1;
  SubroutineSymbol *sub;
  Diagnostic *diag;
  Symbol *ifaceMethod;
  InterfacePortSymbol *port;
  Symbol *conn;
  ModportSymbol *modport;
  InstanceSymbol *inst;
  Symbol *symbol;
  string_view ifaceName;
  Token nameToken;
  SyntaxNode *syntax;
  Scope *scope;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  bitmask<slang::ast::MethodFlags> *in_stack_fffffffffffffbd8;
  Diagnostic *in_stack_fffffffffffffbe0;
  SourceLocation in_stack_fffffffffffffbe8;
  MethodPrototypeSymbol *in_stack_fffffffffffffbf0;
  Token *in_stack_fffffffffffffc00;
  SyntaxNode *in_stack_fffffffffffffc10;
  Diagnostic *in_stack_fffffffffffffc20;
  Diagnostic *this_00;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  undefined1 uVar4;
  char *in_stack_fffffffffffffc30;
  bitmask<slang::ast::MethodFlags> *pbVar5;
  Scope *in_stack_fffffffffffffc38;
  size_t in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  Scope *local_388;
  SourceLocation in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  DiagCode DVar6;
  bitmask<slang::ast::MethodFlags> local_30a;
  MethodPrototypeSymbol *local_308;
  SourceLocation local_300;
  undefined4 local_2f4;
  size_t local_2f0;
  Scope *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined8 in_stack_fffffffffffffd30;
  DiagCode code;
  bitmask<slang::ast::MethodFlags> local_2c2;
  SubroutineSymbol *local_2c0;
  SourceLocation local_2b8;
  undefined4 local_2ac;
  size_t local_2a8;
  char *local_2a0;
  SourceLocation local_298;
  undefined4 local_28c;
  Diagnostic *local_288;
  size_t local_280;
  char *local_278;
  size_t local_270;
  char *local_268;
  SourceLocation local_260;
  undefined4 local_254;
  size_t local_250;
  char *local_248;
  Symbol *local_240;
  size_t local_238;
  char *local_230;
  SourceRange local_228;
  undefined4 local_214;
  SubroutineSymbol *local_210;
  SubroutineSymbol *method;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  MethodPrototypeSymbol *in_stack_fffffffffffffe08;
  int *local_190;
  string_view local_138;
  Token local_128;
  SyntaxNode *local_118;
  Scope *local_110;
  
  DVar6 = SUB84((ulong)in_stack_fffffffffffffc90 >> 0x20,0);
  code = SUB84((ulong)in_stack_fffffffffffffd30 >> 0x20,0);
  if (in_RDI[4].name._M_str == (char *)0x0) {
    method = local_210;
    local_110 = Symbol::getParentScope(in_RDI);
    local_118 = Symbol::getSyntax(in_RDI);
    slang::syntax::SyntaxNode::as<slang::syntax::FunctionDeclarationSyntax>(local_118);
    not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
              ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x6f76f3);
    not_null<slang::syntax::NameSyntax_*>::operator->
              ((not_null<slang::syntax::NameSyntax_*> *)0x6f76ff);
    local_128 = slang::syntax::SyntaxNode::getFirstToken(in_stack_fffffffffffffc10);
    local_138 = parsing::Token::valueText((Token *)in_stack_fffffffffffffbf0);
    name._M_str = in_stack_fffffffffffffc48;
    name._M_len = in_stack_fffffffffffffc40;
    pSVar2 = Scope::find(in_stack_fffffffffffffc38,name);
    if (pSVar2 == (Symbol *)0x0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_138);
      if (!bVar1) {
        parsing::Token::range(in_stack_fffffffffffffc00);
        sourceRange.endLoc._0_4_ = in_stack_fffffffffffffd28;
        sourceRange.startLoc = (SourceLocation)in_stack_fffffffffffffd20;
        sourceRange.endLoc._4_4_ = in_stack_fffffffffffffd2c;
        Scope::addDiag(in_stack_fffffffffffffd18,code,sourceRange);
        arg._M_len._7_1_ = in_stack_fffffffffffffc2f;
        arg._M_len._0_7_ = in_stack_fffffffffffffc28;
        arg._M_str = in_stack_fffffffffffffc30;
        Diagnostic::operator<<(in_stack_fffffffffffffc20,arg);
      }
    }
    else {
      if (pSVar2->kind == InterfacePort) {
        Symbol::as<slang::ast::InterfacePortSymbol>((Symbol *)0x6f786e);
        InterfacePortSymbol::getConnection((InterfacePortSymbol *)in_stack_fffffffffffffbe8);
        std::tie<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>
                  ((Symbol **)in_stack_fffffffffffffbe8,(ModportSymbol **)in_stack_fffffffffffffbe0)
        ;
        std::tuple<slang::ast::Symbol_const*&,slang::ast::ModportSymbol_const*&>::operator=
                  ((tuple<const_slang::ast::Symbol_*&,_const_slang::ast::ModportSymbol_*&> *)
                   in_stack_fffffffffffffbf0,
                   (pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)
                   in_stack_fffffffffffffbe8);
        if (local_190 == (int *)0x0) {
          return;
        }
        if (*local_190 == 0x31) {
          parsing::Token::range(in_stack_fffffffffffffc00);
          sourceRange_00.endLoc._0_4_ = in_stack_fffffffffffffd28;
          sourceRange_00.startLoc = (SourceLocation)in_stack_fffffffffffffd20;
          sourceRange_00.endLoc._4_4_ = in_stack_fffffffffffffd2c;
          Scope::addDiag(in_stack_fffffffffffffd18,code,sourceRange_00);
          return;
        }
        Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x6f794c);
      }
      else {
        if (pSVar2->kind != Instance) {
          if (pSVar2->kind == InstanceArray) {
            parsing::Token::range(in_stack_fffffffffffffc00);
            sourceRange_02.endLoc._0_4_ = in_stack_fffffffffffffd28;
            sourceRange_02.startLoc = (SourceLocation)in_stack_fffffffffffffd20;
            sourceRange_02.endLoc._4_4_ = in_stack_fffffffffffffd2c;
            Scope::addDiag(in_stack_fffffffffffffd18,code,sourceRange_02);
            return;
          }
          if (pSVar2->kind == UninstantiatedDef) {
            return;
          }
          local_214 = 0x27000a;
          local_228 = parsing::Token::range(in_stack_fffffffffffffc00);
          sourceRange_03.endLoc._0_4_ = in_stack_fffffffffffffd28;
          sourceRange_03.startLoc = (SourceLocation)in_stack_fffffffffffffd20;
          sourceRange_03.endLoc._4_4_ = in_stack_fffffffffffffd2c;
          Scope::addDiag(in_stack_fffffffffffffd18,code,sourceRange_03);
          local_238 = local_138._M_len;
          local_230 = local_138._M_str;
          arg_01._M_len._7_1_ = in_stack_fffffffffffffc2f;
          arg_01._M_len._0_7_ = in_stack_fffffffffffffc28;
          arg_01._M_str = in_stack_fffffffffffffc30;
          Diagnostic::operator<<(in_stack_fffffffffffffc20,arg_01);
          return;
        }
        Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x6f7977);
        bVar1 = InstanceSymbol::isInterface((InstanceSymbol *)0x6f798c);
        if (!bVar1) {
          parsing::Token::range(in_stack_fffffffffffffc00);
          sourceRange_01.endLoc._0_4_ = in_stack_fffffffffffffd28;
          sourceRange_01.startLoc = (SourceLocation)in_stack_fffffffffffffd20;
          sourceRange_01.endLoc._4_4_ = in_stack_fffffffffffffd2c;
          Scope::addDiag(in_stack_fffffffffffffd18,code,sourceRange_01);
          arg_00._M_len._7_1_ = in_stack_fffffffffffffc2f;
          arg_00._M_len._0_7_ = in_stack_fffffffffffffc28;
          arg_00._M_str = in_stack_fffffffffffffc30;
          Diagnostic::operator<<(in_stack_fffffffffffffc20,arg_00);
          return;
        }
      }
      local_250 = (in_RDI->name)._M_len;
      local_248 = (in_RDI->name)._M_str;
      name_00._M_str = in_stack_fffffffffffffc48;
      name_00._M_len = in_stack_fffffffffffffc40;
      local_240 = Scope::find(in_stack_fffffffffffffc38,name_00);
      if (local_240 == (Symbol *)0x0) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->name);
        if (!bVar1) {
          local_254 = 0x3a000a;
          local_260 = in_RDI->location;
          Scope::addDiag(local_388,DVar6,in_stack_fffffffffffffc88);
          local_270 = (in_RDI->name)._M_len;
          local_268 = (in_RDI->name)._M_str;
          arg_02._M_len._7_1_ = in_stack_fffffffffffffc2f;
          arg_02._M_len._0_7_ = in_stack_fffffffffffffc28;
          arg_02._M_str = in_stack_fffffffffffffc30;
          Diagnostic::operator<<(in_stack_fffffffffffffc20,arg_02);
          local_280 = local_138._M_len;
          local_278 = local_138._M_str;
          arg_03._M_len._7_1_ = in_stack_fffffffffffffc2f;
          arg_03._M_len._0_7_ = in_stack_fffffffffffffc28;
          arg_03._M_str = in_stack_fffffffffffffc30;
          Diagnostic::operator<<(in_stack_fffffffffffffc20,arg_03);
        }
      }
      else if (local_240->kind == Subroutine) {
        local_2c0 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x6f7d4c);
        pbVar5 = &local_2c0->flags;
        bitmask<slang::ast::MethodFlags>::bitmask(&local_2c2,InterfaceExtern);
        bVar1 = bitmask<slang::ast::MethodFlags>::has
                          ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffbe0,
                           in_stack_fffffffffffffbd8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_308 = getPrototype(local_2c0);
          this_00 = (Diagnostic *)&local_308->flags;
          bitmask<slang::ast::MethodFlags>::bitmask(&local_30a,ForkJoin);
          bVar1 = bitmask<slang::ast::MethodFlags>::has
                            ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffbe0,
                             in_stack_fffffffffffffbd8);
          uVar4 = false;
          if (!bVar1) {
            pEVar3 = MethodPrototypeSymbol::getFirstExternImpl(local_308);
            uVar4 = pEVar3 != (ExternImpl *)0x0;
          }
          if ((bool)uVar4 != false) {
            Scope::addDiag(local_388,DVar6,in_stack_fffffffffffffc88);
            if (*(int *)((long)&in_RDI[2].originatingSyntax + 4) == 0) {
              sv((char *)in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8);
            }
            else {
              sv((char *)in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8);
            }
            arg_06._M_len._7_1_ = uVar4;
            arg_06._M_len._0_7_ = in_stack_fffffffffffffc28;
            arg_06._M_str = (char *)pbVar5;
            Diagnostic::operator<<(this_00,arg_06);
            arg_07._M_len._7_1_ = uVar4;
            arg_07._M_len._0_7_ = in_stack_fffffffffffffc28;
            arg_07._M_str = (char *)pbVar5;
            Diagnostic::operator<<(this_00,arg_07);
            arg_08._M_len._7_1_ = uVar4;
            arg_08._M_len._0_7_ = in_stack_fffffffffffffc28;
            arg_08._M_str = (char *)pbVar5;
            Diagnostic::operator<<(this_00,arg_08);
            MethodPrototypeSymbol::getFirstExternImpl(local_308);
            not_null<const_slang::ast::SubroutineSymbol_*>::operator->
                      ((not_null<const_slang::ast::SubroutineSymbol_*> *)0x6f8045);
            Diagnostic::addNote(in_stack_fffffffffffffbe0,
                                SUB84((ulong)in_stack_fffffffffffffbf0 >> 0x20,0),
                                in_stack_fffffffffffffbe8);
          }
          MethodPrototypeSymbol::addExternImpl
                    (in_stack_fffffffffffffbf0,(SubroutineSymbol *)in_stack_fffffffffffffbe8);
          MethodPrototypeSymbol::checkMethodMatch
                    (in_stack_fffffffffffffe08,
                     (Scope *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),method);
          in_RDI[4].name._M_str = (char *)local_308;
        }
        else {
          Scope::addDiag(local_388,DVar6,in_stack_fffffffffffffc88);
          DVar6 = SUB84((ulong)in_stack_fffffffffffffbf0 >> 0x20,0);
          local_2f0 = (in_RDI->name)._M_len;
          arg_05._M_len._7_1_ = in_stack_fffffffffffffc2f;
          arg_05._M_len._0_7_ = in_stack_fffffffffffffc28;
          arg_05._M_str = (char *)pbVar5;
          Diagnostic::operator<<(in_stack_fffffffffffffc20,arg_05);
          local_2f4 = 0x50001;
          local_300 = local_240->location;
          Diagnostic::addNote(in_stack_fffffffffffffbe0,DVar6,in_stack_fffffffffffffbe8);
        }
      }
      else {
        local_28c = 0x23000a;
        local_298 = in_RDI->location;
        local_288 = Scope::addDiag(local_388,DVar6,in_stack_fffffffffffffc88);
        DVar6 = SUB84((ulong)in_stack_fffffffffffffbf0 >> 0x20,0);
        local_2a8 = (in_RDI->name)._M_len;
        local_2a0 = (in_RDI->name)._M_str;
        arg_04._M_len._7_1_ = in_stack_fffffffffffffc2f;
        arg_04._M_len._0_7_ = in_stack_fffffffffffffc28;
        arg_04._M_str = in_stack_fffffffffffffc30;
        Diagnostic::operator<<(in_stack_fffffffffffffc20,arg_04);
        local_2ac = 0x50001;
        local_2b8 = local_240->location;
        Diagnostic::addNote(in_stack_fffffffffffffbe0,DVar6,in_stack_fffffffffffffbe8);
      }
    }
  }
  return;
}

Assistant:

void SubroutineSymbol::connectExternInterfacePrototype() const {
    if (prototype)
        return;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    auto nameToken = syntax->as<FunctionDeclarationSyntax>().prototype->name->getFirstToken();
    auto ifaceName = nameToken.valueText();
    auto symbol = scope->find(ifaceName);
    if (!symbol) {
        if (!ifaceName.empty())
            scope->addDiag(diag::UndeclaredIdentifier, nameToken.range()) << ifaceName;
        return;
    }

    const InstanceSymbol* inst = nullptr;
    const ModportSymbol* modport = nullptr;
    if (symbol->kind == SymbolKind::InterfacePort) {
        const Symbol* conn;
        auto& port = symbol->as<InterfacePortSymbol>();
        std::tie(conn, modport) = port.getConnection();
        if (!conn)
            return;

        if (conn->kind == SymbolKind::InstanceArray) {
            scope->addDiag(diag::ExternIfaceArrayMethod, nameToken.range());
            return;
        }

        inst = &conn->as<InstanceSymbol>();
    }
    else if (symbol->kind == SymbolKind::Instance) {
        inst = &symbol->as<InstanceSymbol>();
        if (!inst->isInterface()) {
            scope->addDiag(diag::NotAnInterfaceOrPort, nameToken.range()) << ifaceName;
            return;
        }
    }
    else if (symbol->kind == SymbolKind::InstanceArray) {
        scope->addDiag(diag::ExternIfaceArrayMethod, nameToken.range());
        return;
    }
    else {
        if (symbol->kind != SymbolKind::UninstantiatedDef)
            scope->addDiag(diag::NotAnInterfaceOrPort, nameToken.range()) << ifaceName;
        return;
    }

    auto ifaceMethod = inst->body.find(name);
    if (!ifaceMethod) {
        if (!name.empty())
            scope->addDiag(diag::UnknownMember, location) << name << ifaceName;
        return;
    }

    if (ifaceMethod->kind != SymbolKind::Subroutine) {
        auto& diag = scope->addDiag(diag::NotASubroutine, location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, ifaceMethod->location);
        return;
    }

    auto& sub = ifaceMethod->as<SubroutineSymbol>();
    if (!sub.flags.has(MethodFlags::InterfaceExtern)) {
        auto& diag = scope->addDiag(diag::IfaceMethodNotExtern, location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, ifaceMethod->location);
        return;
    }

    auto proto = sub.getPrototype();
    SLANG_ASSERT(proto);

    if (!proto->flags.has(MethodFlags::ForkJoin) && proto->getFirstExternImpl() != nullptr) {
        auto& diag = scope->addDiag(diag::DupInterfaceExternMethod, location);
        diag << (subroutineKind == SubroutineKind::Function ? "function"sv : "task"sv);
        diag << ifaceName << name;
        diag.addNote(diag::NotePreviousDefinition, proto->getFirstExternImpl()->impl->location);
    }

    proto->addExternImpl(*this);
    proto->checkMethodMatch(*scope, *this);
    prototype = proto;

    // If our connection goes through a modport that exports us we should register ourselves
    // as an implementation for that export to facilitate checking for missing exports later.
    if (modport && modport->hasExports) {
        if (auto it = modport->getNameMap().find(name); it != modport->getNameMap().end()) {
            if (it->second && it->second->kind == SymbolKind::MethodPrototype) {
                auto& modportProto = it->second->as<MethodPrototypeSymbol>();
                if (modportProto.flags.has(MethodFlags::ModportExport))
                    modportProto.addExternImpl(*this);
            }
        }
    }
}